

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgList<char> * __thiscall cimg_library::CImgList<char>::assign(CImgList<char> *this,uint n)

{
  undefined8 *puVar1;
  CImg<char> *pCVar2;
  ulong uVar3;
  unsigned_long uVar4;
  ulong *puVar5;
  CImgList<char> *pCVar6;
  long lVar7;
  long lVar8;
  uint n_local;
  
  n_local = n;
  if (n != 0) {
    if (this->_allocated_width < n || n * 4 < this->_allocated_width) {
      pCVar2 = this->_data;
      if (pCVar2 != (CImg<char> *)0x0) {
        if (pCVar2[-1]._data != (char *)0x0) {
          lVar7 = (long)pCVar2[-1]._data << 5;
          do {
            CImg<char>::~CImg((CImg<char> *)((long)&pCVar2[-1]._width + lVar7));
            lVar7 = lVar7 + -0x20;
          } while (lVar7 != 0);
        }
        operator_delete__(&pCVar2[-1]._data);
      }
      uVar4 = cimg::nearest_pow2<unsigned_int>(&n_local);
      uVar3 = 0x10;
      if (0x10 < (uint)uVar4) {
        uVar3 = uVar4;
      }
      this->_allocated_width = (uint)uVar3;
      lVar8 = (uVar3 & 0xffffffff) * 0x20;
      puVar5 = (ulong *)operator_new__(lVar8 + 8);
      *puVar5 = uVar3 & 0xffffffff;
      lVar7 = 0;
      do {
        *(undefined8 *)((long)puVar5 + lVar7 + 0x20) = 0;
        puVar1 = (undefined8 *)((long)puVar5 + lVar7 + 8);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined1 *)((long)puVar5 + lVar7 + 0x18) = 0;
        lVar7 = lVar7 + 0x20;
      } while (lVar8 != lVar7);
      this->_data = (CImg<char> *)(puVar5 + 1);
      n = n_local;
    }
    this->_width = n;
    return this;
  }
  pCVar6 = assign(this);
  return pCVar6;
}

Assistant:

CImgList<T>& assign(const unsigned int n) {
      if (!n) return assign();
      if (_allocated_width<n || _allocated_width>(n<<2)) {
        delete[] _data;
        _data = new CImg<T>[_allocated_width = std::max(16U,(unsigned int)cimg::nearest_pow2(n))];
      }
      _width = n;
      return *this;
    }